

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

Result __thiscall tonk::SecureRandom_Next(tonk *this,uint8_t *key,uint bytes)

{
  int iVar1;
  undefined8 *puVar2;
  Result *success;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)PrngLock);
  if (iVar1 == 0) {
    iVar1 = cymric_random((cymric_rng *)Prng,key,bytes);
    if (iVar1 == 0) {
      *(undefined8 *)this = 0;
    }
    else {
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cymric_random failed","")
      ;
      puVar2 = (undefined8 *)operator_new(0x38);
      *puVar2 = "SecureRandom_Next";
      puVar2[1] = puVar2 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_40,local_40 + local_38)
      ;
      *(undefined4 *)(puVar2 + 5) = 3;
      *(undefined8 **)this = puVar2;
      puVar2[6] = (long)iVar1;
      if (local_40 != local_30) {
        operator_delete(local_40);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)PrngLock);
    return (Result)(ErrorResult *)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

Result SecureRandom_Next(uint8_t* key, unsigned bytes)
{
    Locker locker(PrngLock);
    TONK_DEBUG_ASSERT(PrngInitialized);

    int cymricResult = cymric_random(&Prng, key, static_cast<int>(bytes));
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SecureRandom_Next", "cymric_random failed", ErrorType::Cymric, cymricResult);
    }

    return Result::Success();
}